

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void accumu_var_adf(warm_cb *data,multi_learner *base,example *ec)

{
  uint32_t uVar1;
  action_score *paVar2;
  long in_RDI;
  example *unaff_retaddr;
  size_t a;
  warm_cb *in_stack_00000010;
  float temp_var;
  size_t pred_best_approx;
  ulong local_30;
  float local_24;
  
  uVar1 = predict_sup_adf(in_stack_00000010,(multi_learner *)a,unaff_retaddr);
  local_24 = 0.0;
  for (local_30 = 0; local_30 < *(uint *)(in_RDI + 0xa8); local_30 = local_30 + 1) {
    paVar2 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)(in_RDI + 200),local_30);
    if (uVar1 == paVar2->action + 1) {
      paVar2 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)(in_RDI + 200),local_30);
      local_24 = 1.0 / paVar2->score;
    }
  }
  *(float *)(in_RDI + 0x130) = local_24 + *(float *)(in_RDI + 0x130);
  return;
}

Assistant:

void accumu_var_adf(warm_cb& data, multi_learner& base, example& ec)
{
	size_t pred_best_approx = predict_sup_adf(data, base, ec);
	float temp_var = 0.f;

	for (size_t a = 0; a < data.num_actions; ++a)
		if (pred_best_approx == data.a_s_adf[a].action + 1)
			temp_var = 1.0 / data.a_s_adf[a].score;

	data.cumu_var += temp_var;
}